

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataconvertergenerator.cpp
# Opt level: O0

string * __thiscall
DataConverterGenerator::generateCode_abi_cxx11_
          (string *__return_storage_ptr__,DataConverterGenerator *this)

{
  ulong uVar1;
  size_type sVar2;
  int *arg;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_44;
  undefined1 local_40 [8];
  string indexString;
  int i;
  DataConverterGenerator *this_local;
  string *code;
  
  indexString.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (indexString.field_2._8_4_ = 0; uVar1 = (ulong)(int)indexString.field_2._8_4_,
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->function_), uVar1 < sVar2;
      indexString.field_2._8_4_ = indexString.field_2._8_4_ + 1) {
    local_44 = indexString.field_2._8_4_ + 1;
    boost::lexical_cast<std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (boost *)&local_44,arg);
    std::operator+(&local_98,"    for(int i = 0; i < mux",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_78,&local_98,".size(); i++) {\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    functionToString_abi_cxx11_(&local_b8,this,indexString.field_2._8_4_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    }\n\n");
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DataConverterGenerator::generateCode() {
  std::string code;

  for(int i = 0; i < function_.size(); i++) {
    std::string indexString = boost::lexical_cast<std::string>(i + 1);
    code += "    for(int i = 0; i < mux" + indexString + ".size(); i++) {\n";
    code += functionToString(i);
    code += "    }\n\n";
  }

  return code;
}